

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.cpp
# Opt level: O1

bool camp::test::array::greater_than_or_equal(void)

{
  return true;
}

Assistant:

CAMP_TEST_BEGIN(array, greater_than_or_equal)
{
   camp::array<int, 2> a{1, 2};
   camp::array<int, 2> b{1, 3};

   return a >= a &&
          b >= a &&
          !(a >= b);
}